

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

torrent_state * __thiscall
libtorrent::aux::torrent::get_peer_list_state(torrent_state *__return_storage_ptr__,torrent *this)

{
  bool *pbVar1;
  undefined4 *puVar2;
  byte bVar3;
  _func_int *p_Var4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  external_ip *peVar11;
  undefined4 extraout_var_03;
  unsigned_long __i0;
  long lVar12;
  long lVar13;
  unique_lock<std::mutex> *puVar14;
  unique_lock<std::mutex> local_a0 [8];
  
  __return_storage_ptr__->is_finished = false;
  __return_storage_ptr__->allow_multiple_connections_per_ip = false;
  __return_storage_ptr__->first_time_seen = false;
  __return_storage_ptr__->max_peerlist_size = 1000;
  __return_storage_ptr__->min_reconnect_time = 0x3c;
  __return_storage_ptr__->loop_counter = 0;
  (__return_storage_ptr__->ip).m_addresses[0][0].type_ = ipv4;
  *(undefined8 *)&(__return_storage_ptr__->ip).m_addresses[0][0].ipv4_address_ = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->ip).m_addresses[0][0].ipv6_address_.addr_.__in6_u + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->ip).m_addresses[0][0].ipv6_address_.addr_.__in6_u + 0xc) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->ip).m_addresses[0][0].ipv6_address_.scope_id_ + 4)
       = 0x100000000;
  *(undefined8 *)&(__return_storage_ptr__->ip).m_addresses[0][1].ipv4_address_ = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->ip).m_addresses[0][1].ipv6_address_.addr_.__in6_u + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->ip).m_addresses[0][1].ipv6_address_.addr_.__in6_u + 0xc) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->ip).m_addresses[0][1].ipv6_address_.scope_id_ + 4)
       = 0;
  *(undefined8 *)&(__return_storage_ptr__->ip).m_addresses[1][0].ipv4_address_ = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->ip).m_addresses[1][0].ipv6_address_.addr_.__in6_u + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->ip).m_addresses[1][0].ipv6_address_.addr_.__in6_u + 8) = 0;
  (__return_storage_ptr__->ip).m_addresses[1][0].ipv6_address_.scope_id_ = 0;
  (__return_storage_ptr__->ip).m_addresses[1][1].type_ = ipv6;
  *(undefined8 *)&(__return_storage_ptr__->ip).m_addresses[1][1].ipv4_address_ = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->ip).m_addresses[1][1].ipv6_address_.addr_.__in6_u + 4) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->ip).m_addresses[1][1].ipv6_address_.addr_.__in6_u + 0xc) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->ip).m_addresses[1][1].ipv6_address_.scope_id_ + 4)
       = 0;
  __return_storage_ptr__->max_failcount = 3;
  (__return_storage_ptr__->erased).
  super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->erased).
  super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->erased).
  super__Vector_base<libtorrent::aux::torrent_peer_*,_std::allocator<libtorrent::aux::torrent_peer_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar8 = is_finished(this);
  __return_storage_ptr__->is_finished = bVar8;
  iVar9 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x2e])();
  local_a0[0]._M_device = (mutex_type *)(CONCAT44(extraout_var,iVar9) + 0x438);
  local_a0[0]._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(local_a0);
  local_a0[0]._M_owns = true;
  bVar3 = *(byte *)(CONCAT44(extraout_var,iVar9) + 0x428);
  ::std::unique_lock<std::mutex>::~unique_lock(local_a0);
  __return_storage_ptr__->allow_multiple_connections_per_ip = (bool)(bVar3 & 1);
  p_Var4 = (((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
           [0x2e];
  if (((this->super_torrent_hot_members).field_0x4b & 0x18) == 0) {
    iVar9 = (*p_Var4)();
    local_a0[0]._M_device = (mutex_type *)(CONCAT44(extraout_var_01,iVar9) + 0x438);
    local_a0[0]._M_owns = false;
    ::std::unique_lock<std::mutex>::lock(local_a0);
    iVar9 = *(int *)(CONCAT44(extraout_var_01,iVar9) + 0x27c);
  }
  else {
    iVar9 = (*p_Var4)();
    local_a0[0]._M_device = (mutex_type *)(CONCAT44(extraout_var_00,iVar9) + 0x438);
    local_a0[0]._M_owns = false;
    ::std::unique_lock<std::mutex>::lock(local_a0);
    iVar9 = *(int *)(CONCAT44(extraout_var_00,iVar9) + 0x280);
  }
  local_a0[0]._M_owns = true;
  ::std::unique_lock<std::mutex>::~unique_lock(local_a0);
  __return_storage_ptr__->max_peerlist_size = iVar9;
  iVar9 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x2e])();
  local_a0[0]._M_device = (mutex_type *)(CONCAT44(extraout_var_02,iVar9) + 0x438);
  local_a0[0]._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(local_a0);
  local_a0[0]._M_owns = true;
  iVar9 = *(int *)(CONCAT44(extraout_var_02,iVar9) + 0x1e8);
  ::std::unique_lock<std::mutex>::~unique_lock(local_a0);
  __return_storage_ptr__->min_reconnect_time = iVar9;
  puVar14 = local_a0;
  (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[3])
            (puVar14);
  peVar11 = &__return_storage_ptr__->ip;
  lVar12 = 0;
  do {
    lVar13 = 0;
    do {
      *(undefined4 *)((long)&peVar11->m_addresses[0][0].type_ + lVar13) =
           *(undefined4 *)((long)&puVar14->_M_device + lVar13);
      *(undefined4 *)((long)&peVar11->m_addresses[0][0].ipv4_address_.addr_.s_addr + lVar13) =
           *(undefined4 *)((long)&puVar14->_M_device + lVar13 + 4);
      pbVar1 = &puVar14->_M_owns + lVar13;
      uVar5 = *(undefined4 *)(pbVar1 + 4);
      uVar6 = *(undefined4 *)(pbVar1 + 8);
      uVar7 = *(undefined4 *)(pbVar1 + 0xc);
      puVar2 = (undefined4 *)
               ((long)&peVar11->m_addresses[0][0].ipv6_address_.addr_.__in6_u + lVar13);
      *puVar2 = *(undefined4 *)pbVar1;
      puVar2[1] = uVar5;
      puVar2[2] = uVar6;
      puVar2[3] = uVar7;
      *(undefined8 *)((long)&peVar11->m_addresses[0][0].ipv6_address_.scope_id_ + lVar13) =
           *(undefined8 *)(&puVar14[1]._M_owns + lVar13);
      lVar13 = lVar13 + 0x20;
    } while (lVar13 != 0x40);
    lVar12 = lVar12 + 1;
    puVar14 = puVar14 + 4;
    peVar11 = (external_ip *)(peVar11->m_addresses + 1);
  } while (lVar12 != 2);
  uVar10 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
             [0x20])();
  __return_storage_ptr__->port = uVar10 & 0xffff;
  iVar9 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x2e])();
  local_a0[0]._M_device = (mutex_type *)(CONCAT44(extraout_var_03,iVar9) + 0x438);
  local_a0[0]._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(local_a0);
  local_a0[0]._M_owns = true;
  iVar9 = *(int *)(CONCAT44(extraout_var_03,iVar9) + 0x1e4);
  ::std::unique_lock<std::mutex>::~unique_lock(local_a0);
  __return_storage_ptr__->max_failcount = iVar9;
  return __return_storage_ptr__;
}

Assistant:

torrent_state torrent::get_peer_list_state()
	{
		torrent_state ret;
		ret.is_finished = is_finished();
		ret.allow_multiple_connections_per_ip = settings().get_bool(settings_pack::allow_multiple_connections_per_ip);
		ret.max_peerlist_size = is_paused()
			? settings().get_int(settings_pack::max_paused_peerlist_size)
			: settings().get_int(settings_pack::max_peerlist_size);
		ret.min_reconnect_time = settings().get_int(settings_pack::min_reconnect_time);

		ret.ip = m_ses.external_address();
		ret.port = m_ses.listen_port();
		ret.max_failcount = settings().get_int(settings_pack::max_failcount);
		return ret;
	}